

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyHashDeleteEntry(SyHash *pHash,void *pKey,sxu32 nKeyLen,void **ppUserData)

{
  SyHashEntry_Pr *pEntry_00;
  sxi32 rc;
  SyHashEntry_Pr *pEntry;
  void **ppUserData_local;
  sxu32 nKeyLen_local;
  void *pKey_local;
  SyHash *pHash_local;
  
  pEntry_00 = HashGetEntry(pHash,pKey,nKeyLen);
  if (pEntry_00 == (SyHashEntry_Pr *)0x0) {
    pHash_local._4_4_ = -6;
  }
  else {
    pHash_local._4_4_ = HashDeleteEntry(pHash,pEntry_00,ppUserData);
  }
  return pHash_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyHashDeleteEntry(SyHash *pHash, const void *pKey, sxu32 nKeyLen, void **ppUserData)
{
	SyHashEntry_Pr *pEntry;
	sxi32 rc;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) ){
		return SXERR_CORRUPT;
	}
#endif
	pEntry = HashGetEntry(&(*pHash), pKey, nKeyLen);
	if( pEntry == 0 ){
		return SXERR_NOTFOUND;
	}
	rc = HashDeleteEntry(&(*pHash), pEntry, ppUserData);
	return rc;
}